

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS ref_split_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT new_cell;
  REF_INT node;
  REF_INT cell_to_split [100];
  int local_b0;
  int local_ac;
  REF_INT cell_in_list;
  REF_INT ncell;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->cell[8];
  ref_grid_local._4_4_ = ref_cell_list_with2(pRVar2,node0,node1,100,&local_ac,&new_cell);
  if (ref_grid_local._4_4_ != 7) {
    if (ref_grid_local._4_4_ == 0) {
      for (local_b0 = 0; local_b0 < local_ac; local_b0 = local_b0 + 1) {
        RVar1 = (&new_cell)[local_b0];
        uVar3 = ref_cell_nodes(pRVar2,RVar1,&cell_in_list);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x19b,"ref_split_edge",(ulong)uVar3,"cell nodes");
          return uVar3;
        }
        uVar3 = ref_cell_remove(pRVar2,RVar1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x19c,"ref_split_edge",(ulong)uVar3,"remove");
          return uVar3;
        }
        for (status = 0; status < pRVar2->node_per; status = status + 1) {
          if (node0 == (&cell_in_list)[status]) {
            (&cell_in_list)[status] = new_node;
          }
        }
        uVar3 = ref_cell_add(pRVar2,&cell_in_list,&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x1a0,"ref_split_edge",(ulong)uVar3,"add node0 version");
          return uVar3;
        }
        for (status = 0; status < pRVar2->node_per; status = status + 1) {
          if (new_node == (&cell_in_list)[status]) {
            (&cell_in_list)[status] = node0;
          }
        }
        for (status = 0; status < pRVar2->node_per; status = status + 1) {
          if (node1 == (&cell_in_list)[status]) {
            (&cell_in_list)[status] = new_node;
          }
        }
        uVar3 = ref_cell_add(pRVar2,&cell_in_list,&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x1a6,"ref_split_edge",(ulong)uVar3,"add node1 version");
          return uVar3;
        }
      }
      pRVar2 = ref_grid->cell[3];
      ref_grid_local._4_4_ = ref_cell_list_with2(pRVar2,node0,node1,100,&local_ac,&new_cell);
      if (ref_grid_local._4_4_ == 0) {
        for (local_b0 = 0; local_b0 < local_ac; local_b0 = local_b0 + 1) {
          RVar1 = (&new_cell)[local_b0];
          uVar3 = ref_cell_nodes(pRVar2,RVar1,&cell_in_list);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x1b0,"ref_split_edge",(ulong)uVar3,"cell nodes");
            return uVar3;
          }
          uVar3 = ref_cell_remove(pRVar2,RVar1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x1b1,"ref_split_edge",(ulong)uVar3,"remove");
            return uVar3;
          }
          for (status = 0; status < pRVar2->node_per; status = status + 1) {
            if (node0 == (&cell_in_list)[status]) {
              (&cell_in_list)[status] = new_node;
            }
          }
          uVar3 = ref_cell_add(pRVar2,&cell_in_list,&ref_private_macro_code_rss);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x1b5,"ref_split_edge",(ulong)uVar3,"add node0 version");
            return uVar3;
          }
          for (status = 0; status < pRVar2->node_per; status = status + 1) {
            if (new_node == (&cell_in_list)[status]) {
              (&cell_in_list)[status] = node0;
            }
          }
          for (status = 0; status < pRVar2->node_per; status = status + 1) {
            if (node1 == (&cell_in_list)[status]) {
              (&cell_in_list)[status] = new_node;
            }
          }
          uVar3 = ref_cell_add(pRVar2,&cell_in_list,&ref_private_macro_code_rss);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x1bb,"ref_split_edge",(ulong)uVar3,"add node1 version");
            return uVar3;
          }
        }
        pRVar2 = ref_grid->cell[0];
        ref_grid_local._4_4_ = ref_cell_list_with2(pRVar2,node0,node1,100,&local_ac,&new_cell);
        if (ref_grid_local._4_4_ == 0) {
          for (local_b0 = 0; local_b0 < local_ac; local_b0 = local_b0 + 1) {
            RVar1 = (&new_cell)[local_b0];
            uVar3 = ref_cell_nodes(pRVar2,RVar1,&cell_in_list);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1c5,"ref_split_edge",(ulong)uVar3,"cell nodes");
              return uVar3;
            }
            uVar3 = ref_cell_remove(pRVar2,RVar1);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1c6,"ref_split_edge",(ulong)uVar3,"remove");
              return uVar3;
            }
            for (status = 0; status < pRVar2->node_per; status = status + 1) {
              if (node0 == (&cell_in_list)[status]) {
                (&cell_in_list)[status] = new_node;
              }
            }
            uVar3 = ref_cell_add(pRVar2,&cell_in_list,&ref_private_macro_code_rss);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1ca,"ref_split_edge",(ulong)uVar3,"add node0 version");
              return uVar3;
            }
            for (status = 0; status < pRVar2->node_per; status = status + 1) {
              if (new_node == (&cell_in_list)[status]) {
                (&cell_in_list)[status] = node0;
              }
            }
            for (status = 0; status < pRVar2->node_per; status = status + 1) {
              if (node1 == (&cell_in_list)[status]) {
                (&cell_in_list)[status] = new_node;
              }
            }
            uVar3 = ref_cell_add(pRVar2,&cell_in_list,&ref_private_macro_code_rss);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1d0,"ref_split_edge",(ulong)uVar3,"add node1 version");
              return uVar3;
            }
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x1c1,"ref_split_edge",(ulong)ref_grid_local._4_4_,
                 "get edg list, should have been smaller then tets");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x1ac,"ref_split_edge",(ulong)ref_grid_local._4_4_,
               "get tri list, should have been smaller then tets");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x197
             ,"ref_split_edge",(ulong)ref_grid_local._4_4_,"tet list to split");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_split[MAX_CELL_SPLIT];
  REF_INT node, new_cell;
  REF_STATUS status;

  ref_cell = ref_grid_tet(ref_grid);
  status = ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                               cell_to_split);
  if (REF_INCREASE_LIMIT == status) return status;
  RSS(status, "tet list to split");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get tri list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get edg list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  return REF_SUCCESS;
}